

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-trust-schema-rule.c
# Opt level: O3

int ndn_trust_schema_rule_from_strings
              (ndn_trust_schema_rule_t *rule,char *data_name_pattern_string,
              uint32_t data_name_pattern_string_size,char *key_name_pattern_string,
              uint32_t key_name_pattern_string_size)

{
  int iVar1;
  
  iVar1 = ndn_trust_schema_pattern_from_string
                    (&rule->data_pattern,data_name_pattern_string,data_name_pattern_string_size);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = ndn_trust_schema_pattern_from_string
                    (&rule->key_pattern,key_name_pattern_string,key_name_pattern_string_size);
  return iVar1;
}

Assistant:

int
ndn_trust_schema_rule_from_strings(ndn_trust_schema_rule_t* rule,
				                           const char* data_name_pattern_string, uint32_t data_name_pattern_string_size,
				                           const char* key_name_pattern_string, uint32_t key_name_pattern_string_size)
{
  int ret_val = -1;
  ret_val = ndn_trust_schema_pattern_from_string(&rule->data_pattern, data_name_pattern_string, data_name_pattern_string_size);
  if (ret_val != 0) {
    return ret_val;
  }

  ret_val = ndn_trust_schema_pattern_from_string(&rule->key_pattern, key_name_pattern_string, key_name_pattern_string_size);
  if (ret_val != 0) {
    return ret_val;
  }

  return 0;
}